

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
double_writer::operator()(double_writer *this,counting_iterator<char> *it)

{
  long lVar1;
  char *pcVar2;
  counting_iterator<char> *in_RSI;
  long *in_RDI;
  counting_iterator<char> cVar3;
  type tVar4;
  counting_iterator<char> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  counting_iterator<char> local_20;
  counting_iterator<char> *local_10;
  
  local_10 = in_RSI;
  if ((char)in_RDI[1] != '\0') {
    lVar1 = in_RDI[1];
    cVar3 = internal::counting_iterator<char>::operator++(in_stack_ffffffffffffff78,0);
    local_20.count_ = cVar3.count_;
    local_20.blackhole_ = cVar3.blackhole_;
    pcVar2 = internal::counting_iterator<char>::operator*(&local_20);
    *pcVar2 = (char)lVar1;
    *in_RDI = *in_RDI + -1;
  }
  internal::basic_buffer<char>::begin((basic_buffer<char> *)in_RDI[2]);
  internal::basic_buffer<char>::end((basic_buffer<char> *)in_RDI[2]);
  tVar4 = internal::copy_str<char,char*,fmt::v5::internal::counting_iterator<char>>
                    ((char *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98,*local_10);
  local_10->count_ = tVar4.count_;
  local_10->blackhole_ = tVar4.blackhole_;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }